

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_ManSatPrintStats(Cbs2_Man_t *p)

{
  uint uVar1;
  double local_a0;
  double local_90;
  double local_80;
  double local_70;
  double local_60;
  double local_50;
  double local_40;
  double local_30;
  double local_20;
  Cbs2_Man_t *p_local;
  
  uVar1 = Gia_ManCoNum(p->pAig);
  printf("CO = %8d  ",(ulong)uVar1);
  uVar1 = Gia_ManAndNum(p->pAig);
  printf("AND = %8d  ",(ulong)uVar1);
  printf("Conf = %6d  ",(ulong)(uint)(p->Pars).nBTLimit);
  printf("JustMax = %5d  ",(ulong)(uint)(p->Pars).nJustLimit);
  printf("\n");
  if (p->nSatTotal == 0) {
    local_20 = 0.0;
  }
  else {
    local_20 = ((double)p->nSatUnsat * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatUnsat == 0) {
    local_30 = 0.0;
  }
  else {
    local_30 = ((double)p->nConfUnsat * 1.0) / (double)p->nSatUnsat;
  }
  printf("Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",local_20,local_30,
         (ulong)(uint)p->nSatUnsat);
  Abc_Print(1,"%s =","Time");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_40 = ((double)p->timeSatUnsat * 100.0) / (double)p->timeTotal;
  }
  else {
    local_40 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUnsat * 1.0) / 1000000.0,local_40);
  if (p->nSatTotal == 0) {
    local_50 = 0.0;
  }
  else {
    local_50 = ((double)p->nSatSat * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatSat == 0) {
    local_60 = 0.0;
  }
  else {
    local_60 = ((double)p->nConfSat * 1.0) / (double)p->nSatSat;
  }
  printf("Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",local_50,local_60,
         (ulong)(uint)p->nSatSat);
  Abc_Print(1,"%s =","Time");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_70 = ((double)p->timeSatSat * 100.0) / (double)p->timeTotal;
  }
  else {
    local_70 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatSat * 1.0) / 1000000.0,local_70);
  if (p->nSatTotal == 0) {
    local_80 = 0.0;
  }
  else {
    local_80 = ((double)p->nSatUndec * 100.0) / (double)p->nSatTotal;
  }
  if (p->nSatUndec == 0) {
    local_90 = 0.0;
  }
  else {
    local_90 = ((double)p->nConfUndec * 1.0) / (double)p->nSatUndec;
  }
  printf("Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ",local_80,local_90,
         (ulong)(uint)p->nSatUndec);
  Abc_Print(1,"%s =","Time");
  if (((double)p->timeTotal != 0.0) || (NAN((double)p->timeTotal))) {
    local_a0 = ((double)p->timeSatUndec * 100.0) / (double)p->timeTotal;
  }
  else {
    local_a0 = 0.0;
  }
  Abc_Print(1,"%9.2f sec (%6.2f %%)\n",((double)p->timeSatUndec * 1.0) / 1000000.0,local_a0);
  Abc_Print(1,"%s =","Total time");
  Abc_Print(1,"%9.2f sec\n",((double)p->timeTotal * 1.0) / 1000000.0);
  return;
}

Assistant:

void Cbs2_ManSatPrintStats( Cbs2_Man_t * p )
{
    printf( "CO = %8d  ", Gia_ManCoNum(p->pAig) );
    printf( "AND = %8d  ", Gia_ManAndNum(p->pAig) );
    printf( "Conf = %6d  ", p->Pars.nBTLimit );
    printf( "JustMax = %5d  ", p->Pars.nJustLimit );
    printf( "\n" );
    printf( "Unsat calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUnsat, p->nSatTotal? 100.0*p->nSatUnsat/p->nSatTotal :0.0, p->nSatUnsat? 1.0*p->nConfUnsat/p->nSatUnsat :0.0 );
    ABC_PRTP( "Time", p->timeSatUnsat, p->timeTotal );
    printf( "Sat   calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatSat,   p->nSatTotal? 100.0*p->nSatSat/p->nSatTotal :0.0, p->nSatSat? 1.0*p->nConfSat/p->nSatSat : 0.0 );
    ABC_PRTP( "Time", p->timeSatSat,   p->timeTotal );
    printf( "Undef calls %6d  (%6.2f %%)   Ave conf = %8.1f   ", 
        p->nSatUndec, p->nSatTotal? 100.0*p->nSatUndec/p->nSatTotal :0.0, p->nSatUndec? 1.0*p->nConfUndec/p->nSatUndec : 0.0 );
    ABC_PRTP( "Time", p->timeSatUndec, p->timeTotal );
    ABC_PRT( "Total time", p->timeTotal );
}